

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

string * anon_unknown.dwarf_330c7::get_word(string *str_to_parse)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  string *word;
  string local_40 [39];
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_10 = in_RSI;
  for (local_18 = 0; uVar1 = local_18, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3;
      local_18 = local_18 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    iVar2 = isspace((int)*pcVar4);
    if (iVar2 == 0) break;
  }
  do {
    uVar1 = local_18;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar1) {
LAB_0013a5a8:
      local_19 = 0;
      std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
      std::__cxx11::string::substr((ulong)local_40,(ulong)local_10);
      std::__cxx11::string::operator=(local_10,local_40);
      std::__cxx11::string::~string(local_40);
      return in_RDI;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    iVar2 = isspace((int)*pcVar4);
    if (iVar2 != 0) goto LAB_0013a5a8;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

std::string get_word(std::string& str_to_parse) {
    size_t i = 0;
    for (; i < str_to_parse.size(); ++i) if (!std::isspace(str_to_parse[i])) break;
    for (; i < str_to_parse.size(); ++i) if (std::isspace(str_to_parse[i])) break;
    std::string word = str_to_parse.substr(0, i);
    str_to_parse = str_to_parse.substr(i);
    return word;
}